

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  float fVar1;
  undefined8 uVar2;
  int numSamples;
  pointer pPVar3;
  VertexPacket *pVVar4;
  pointer pPVar5;
  pointer pFVar6;
  pointer pFVar7;
  pointer pPVar8;
  pointer pFVar9;
  pointer pFVar10;
  pointer pFVar11;
  pointer pGVar12;
  pointer pGVar13;
  pointer pGVar14;
  pointer pFVar15;
  pointer pFVar16;
  pointer pFVar17;
  pointer pPVar18;
  float *depthValues_00;
  ulong uVar19;
  uint uVar20;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *pvVar21;
  size_t ndx;
  ulong uVar22;
  float fVar23;
  FaceType in_stack_fffffffffffffc58;
  int numRasterizedPackets;
  int local_39c;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *local_398;
  RasterizationState *local_390;
  _Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_> local_388;
  _Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> local_368;
  _Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> local_348;
  RasterizationInternalBuffers local_328;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  pointer local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  float local_29c;
  undefined8 local_298;
  float local_290;
  float local_28c;
  undefined8 local_288;
  vector<float,_std::allocator<float>_> depthValues;
  IVec4 renderTargetRect;
  TriangleRasterizer rasterizer1;
  IVec4 local_168;
  IVec4 local_150;
  FragmentShadingContext shadingContext;
  TriangleRasterizer rasterizer2;
  
  rasterizer1.m_numSamples = 0;
  rasterizer1.m_winding = WINDING_CCW;
  rasterizer1.m_viewport.m_data[0] = 0;
  rasterizer1.m_viewport.m_data[1] = 0;
  rasterizer1.m_viewport.m_data[2] = 0;
  rasterizer1.m_viewport.m_data[3] = 0;
  local_398 = primList;
  if ((state->fragOps).depthClampEnabled == false) {
    uVar22 = 0;
    while( true ) {
      pPVar18 = (local_398->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (local_398->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)pPVar3 - (long)pPVar18 >> 3) <= uVar22) break;
      pVVar4 = pPVar18[uVar22].v0;
      fVar1 = (pVVar4->position).m_data[2];
      fVar23 = (pVVar4->position).m_data[3];
      if ((-fVar23 <= fVar1) && (fVar1 <= fVar23)) {
        rasterizer2.m_viewport.m_data._0_8_ = pVVar4;
        std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::emplace_back<rr::pa::Point>
                  ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&rasterizer1,
                   (Point *)&rasterizer2);
      }
      uVar22 = uVar22 + 1;
    }
    pPVar8 = (pointer)CONCAT44(rasterizer1.m_winding,rasterizer1.m_numSamples);
    pPVar5 = (local_398->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    rasterizer1.m_numSamples = (int)pPVar5;
    rasterizer1.m_winding = (Winding)((ulong)pPVar5 >> 0x20);
    pPVar5 = (pointer)CONCAT44(rasterizer1.m_viewport.m_data[3],rasterizer1.m_viewport.m_data[2]);
    rasterizer1.m_viewport.m_data[2] = (int)pPVar3;
    rasterizer1.m_viewport.m_data[3] = (int)((ulong)pPVar3 >> 0x20);
    (local_398->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)rasterizer1.m_viewport.m_data._0_8_;
    (local_398->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_finish = pPVar5;
    (local_398->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = pPVar8;
    rasterizer1.m_viewport.m_data._0_8_ = pPVar18;
  }
  pvVar21 = local_398;
  std::_Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>::~_Vector_base
            ((_Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&rasterizer1);
  for (pPVar18 = (pvVar21->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pPVar18 !=
      (pvVar21->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
      super__Vector_impl_data._M_finish; pPVar18 = pPVar18 + 1) {
    anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pPVar18->v0);
  }
  pFVar6 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pFVar7 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_2c8 = (long)*(int *)&renderTarget->field_0x8;
  local_168.m_data[0] = (state->viewport).rect.left;
  local_168.m_data[1] = (state->viewport).rect.bottom;
  local_168.m_data[2] = (state->viewport).rect.width;
  local_168.m_data[3] = (state->viewport).rect.height;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&rasterizer1,
             (MultisamplePixelBufferAccess *)renderTarget);
  local_150.m_data[0] = 0;
  local_150.m_data[1] = 0;
  local_150.m_data[3] = rasterizer1.m_numSamples;
  local_150.m_data[2] = rasterizer1.m_viewport.m_data[3];
  anon_unknown_19::rectIntersection(&local_168,&local_150);
  std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::vector
            ((vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)&local_348,0x80,
             (allocator_type *)&rasterizer1);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)&local_368,
             ((long)pFVar6 - (long)pFVar7) * 0x40000000 >> 0x17,(allocator_type *)&rasterizer1);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::vector
            ((vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)&local_388,0x200,
             (allocator_type *)&rasterizer1);
  std::vector<float,_std::allocator<float>_>::vector(&depthValues,0,(allocator_type *)&rasterizer1);
  pvVar21 = local_398;
  local_328.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&rasterizer1,&renderTarget->m_depthBuffer);
  if (((rasterizer1.m_viewport.m_data[2] == 0) || (rasterizer1.m_viewport.m_data[3] == 0)) ||
     (rasterizer1.m_numSamples == 0)) {
    depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (float *)0x0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(&depthValues,local_2c8 << 9);
  }
  pFVar17 = local_328.shadedFragments.
            super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pFVar16 = local_328.shadedFragments.
            super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pFVar15 = local_328.shadedFragments.
            super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
            super__Vector_impl_data._M_start;
  pGVar14 = local_328.shaderOutputs.
            super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pGVar13 = local_328.shaderOutputs.
            super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pGVar12 = local_328.shaderOutputs.
            super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar11 = local_328.fragmentPackets.
            super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pFVar10 = local_328.fragmentPackets.
            super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pFVar9 = local_328.fragmentPackets.
           super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_328.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_348._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_328.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_start = local_348._M_impl.super__Vector_impl_data._M_start;
  local_328.fragmentPackets.
  super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
  super__Vector_impl_data._M_finish = local_348._M_impl.super__Vector_impl_data._M_finish;
  local_348._M_impl.super__Vector_impl_data._M_start = pFVar9;
  local_348._M_impl.super__Vector_impl_data._M_finish = pFVar10;
  local_348._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar11;
  local_328.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_368._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_328.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_start = local_368._M_impl.super__Vector_impl_data._M_start;
  local_328.shaderOutputs.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_368._M_impl.super__Vector_impl_data._M_finish;
  local_368._M_impl.super__Vector_impl_data._M_start = pGVar12;
  local_368._M_impl.super__Vector_impl_data._M_finish = pGVar13;
  local_368._M_impl.super__Vector_impl_data._M_end_of_storage = pGVar14;
  local_328.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_388._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_328.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = local_388._M_impl.super__Vector_impl_data._M_start;
  local_328.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = local_388._M_impl.super__Vector_impl_data._M_finish;
  local_388._M_impl.super__Vector_impl_data._M_start = pFVar15;
  local_388._M_impl.super__Vector_impl_data._M_finish = pFVar16;
  local_388._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar17;
  local_390 = &state->rasterization;
  pPVar18 = (pvVar21->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_328.fragmentDepthBuffer =
       depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
       ._M_start;
  while (pPVar18 !=
         (pvVar21->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
         super__Vector_impl_data._M_finish) {
    numSamples = *(int *)&renderTarget->field_0x8;
    local_2d8 = ZEXT416((uint)(state->viewport).zn);
    fVar1 = (state->viewport).zf;
    TriangleRasterizer::TriangleRasterizer(&rasterizer1,&renderTargetRect,numSamples,local_390);
    TriangleRasterizer::TriangleRasterizer(&rasterizer2,&renderTargetRect,numSamples,local_390);
    pVVar4 = pPVar18->v0;
    fVar23 = pVVar4->pointSize * 0.5;
    uVar2 = *(undefined8 *)(pVVar4->position).m_data;
    local_290 = (float)uVar2;
    local_2a0 = fVar23 + local_290;
    local_29c = (float)((ulong)uVar2 >> 0x20);
    local_28c = fVar23 + local_29c;
    local_2b0 = CONCAT44(local_28c,local_2a0);
    local_2a8 = *(undefined8 *)((pVVar4->position).m_data + 2);
    local_290 = local_290 - fVar23;
    local_29c = local_29c - fVar23;
    local_298 = local_2a8;
    local_288 = local_2a8;
    TriangleRasterizer::init(&rasterizer1,(EVP_PKEY_CTX *)&local_2b0);
    TriangleRasterizer::init(&rasterizer2,(EVP_PKEY_CTX *)&local_2b0);
    FragmentShadingContext::FragmentShadingContext
              (&shadingContext,pPVar18->v0->outputs,(GenericVec4 *)0x0,(GenericVec4 *)0x0,
               local_328.shaderOutputs.
               super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
               super__Vector_impl_data._M_start,local_328.fragmentDepthBuffer,
               (int)((ulong)((long)(program->fragmentShader->m_outputs).
                                   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(program->fragmentShader->m_outputs).
                                  super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2),numSamples,0,
               in_stack_fffffffffffffc58);
    uStack_2c0 = local_2d8._8_4_;
    uStack_2bc = local_2d8._12_4_;
    local_2c8 = CONCAT44(local_2d8._4_4_,
                         ~-(uint)((float)local_2d8._0_4_ <= fVar1) & (uint)fVar1 |
                         -(uint)((float)local_2d8._0_4_ <= fVar1) & local_2d8._0_4_);
    local_2d8 = ZEXT416(~-(uint)(fVar1 <= (float)local_2d8._0_4_) & (uint)fVar1 |
                        local_2d8._0_4_ & -(uint)(fVar1 <= (float)local_2d8._0_4_));
    local_2b8 = pPVar18;
    while( true ) {
      numRasterizedPackets = 0;
      uVar20 = (uint)((ulong)((long)local_328.fragmentPackets.
                                    super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_328.fragmentPackets.
                                   super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 6);
      TriangleRasterizer::rasterize
                (&rasterizer1,
                 local_328.fragmentPackets.
                 super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl
                 .super__Vector_impl_data._M_start,local_328.fragmentDepthBuffer,uVar20,
                 &numRasterizedPackets);
      if (uVar20 != numRasterizedPackets) {
        depthValues_00 = local_328.fragmentDepthBuffer + numRasterizedPackets * numSamples * 4;
        if (local_328.fragmentDepthBuffer == (float *)0x0) {
          depthValues_00 = (float *)0x0;
        }
        local_39c = 0;
        TriangleRasterizer::rasterize
                  (&rasterizer2,
                   local_328.fragmentPackets.
                   super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>.
                   _M_impl.super__Vector_impl_data._M_start + numRasterizedPackets,depthValues_00,
                   uVar20 - numRasterizedPackets,&local_39c);
        uVar20 = numRasterizedPackets + local_39c;
        numRasterizedPackets = uVar20;
      }
      if (uVar20 == 0) break;
      (**program->fragmentShader->_vptr_FragmentShader)
                (program->fragmentShader,
                 local_328.fragmentPackets.
                 super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl
                 .super__Vector_impl_data._M_start,(ulong)uVar20,&shadingContext);
      if ((local_328.fragmentDepthBuffer != (float *)0x0) &&
         ((state->fragOps).depthClampEnabled == true)) {
        uVar20 = numRasterizedPackets * numSamples * 4;
        uVar22 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar22 = 0;
        }
        for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
          fVar1 = local_328.fragmentDepthBuffer[uVar19];
          fVar23 = (float)local_2d8._0_4_;
          if (fVar1 <= (float)local_2d8._0_4_) {
            fVar23 = fVar1;
          }
          local_328.fragmentDepthBuffer[uVar19] =
               (float)(-(uint)(fVar1 < (float)local_2c8) & (uint)(float)local_2c8 |
                      ~-(uint)(fVar1 < (float)local_2c8) & (uint)fVar23);
        }
      }
      anon_unknown_19::writeFragmentPackets
                (state,renderTarget,program,
                 local_328.fragmentPackets.
                 super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl
                 .super__Vector_impl_data._M_start,numRasterizedPackets,FACETYPE_FRONT,
                 &local_328.shaderOutputs,local_328.fragmentDepthBuffer,&local_328.shadedFragments);
    }
    pvVar21 = local_398;
    pPVar18 = local_2b8 + 1;
  }
  anon_unknown_19::RasterizationInternalBuffers::~RasterizationInternalBuffers(&local_328);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&depthValues.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>::~_Vector_base(&local_388);
  std::_Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::~_Vector_base(&local_368);
  std::_Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::~_Vector_base
            (&local_348);
  return;
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}